

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VCVT_fix_sp(DisasContext_conflict1 *s,arg_VCVT_fix_sp *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i32 var;
  TCGv_ptr arg3;
  TCGv_i32 arg2;
  int32_t local_48;
  int frac_bits;
  TCGv_ptr fpst;
  TCGv_i32 shift;
  TCGv_i32 vd;
  TCGContext_conflict1 *tcg_ctx;
  arg_VCVT_fix_sp *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = isar_feature_aa32_fpsp_v3(s->isar);
  if (_Var1) {
    _Var1 = vfp_access_check(s);
    if (_Var1) {
      if ((a->opc & 1U) == 0) {
        local_48 = 0x10 - a->imm;
      }
      else {
        local_48 = 0x20 - a->imm;
      }
      var = tcg_temp_new_i32(tcg_ctx_00);
      neon_load_reg32(tcg_ctx_00,var,a->vd);
      arg3 = get_fpstatus_ptr_aarch64(tcg_ctx_00,0);
      arg2 = tcg_const_i32_aarch64(tcg_ctx_00,local_48);
      switch(a->opc) {
      case 0:
        gen_helper_vfp_shtos(tcg_ctx_00,var,var,arg2,arg3);
        break;
      case 1:
        gen_helper_vfp_sltos(tcg_ctx_00,var,var,arg2,arg3);
        break;
      case 2:
        gen_helper_vfp_uhtos(tcg_ctx_00,var,var,arg2,arg3);
        break;
      case 3:
        gen_helper_vfp_ultos(tcg_ctx_00,var,var,arg2,arg3);
        break;
      case 4:
        gen_helper_vfp_toshs_round_to_zero(tcg_ctx_00,var,var,arg2,arg3);
        break;
      case 5:
        gen_helper_vfp_tosls_round_to_zero(tcg_ctx_00,var,var,arg2,arg3);
        break;
      case 6:
        gen_helper_vfp_touhs_round_to_zero(tcg_ctx_00,var,var,arg2,arg3);
        break;
      case 7:
        gen_helper_vfp_touls_round_to_zero(tcg_ctx_00,var,var,arg2,arg3);
        break;
      default:
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-vfp.inc.c"
                   ,0xab3,(char *)0x0);
      }
      neon_store_reg32(tcg_ctx_00,var,a->vd);
      tcg_temp_free_i32(tcg_ctx_00,var);
      tcg_temp_free_i32(tcg_ctx_00,arg2);
      tcg_temp_free_ptr(tcg_ctx_00,arg3);
      s_local._7_1_ = true;
    }
    else {
      s_local._7_1_ = true;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VCVT_fix_sp(DisasContext *s, arg_VCVT_fix_sp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 vd, shift;
    TCGv_ptr fpst;
    int frac_bits;

    if (!dc_isar_feature(aa32_fpsp_v3, s)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    frac_bits = (a->opc & 1) ? (32 - a->imm) : (16 - a->imm);

    vd = tcg_temp_new_i32(tcg_ctx);
    neon_load_reg32(tcg_ctx, vd, a->vd);

    fpst = get_fpstatus_ptr(tcg_ctx, false);
    shift = tcg_const_i32(tcg_ctx, frac_bits);

    /* Switch on op:U:sx bits */
    switch (a->opc) {
    case 0:
        gen_helper_vfp_shtos(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 1:
        gen_helper_vfp_sltos(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 2:
        gen_helper_vfp_uhtos(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 3:
        gen_helper_vfp_ultos(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 4:
        gen_helper_vfp_toshs_round_to_zero(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 5:
        gen_helper_vfp_tosls_round_to_zero(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 6:
        gen_helper_vfp_touhs_round_to_zero(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 7:
        gen_helper_vfp_touls_round_to_zero(tcg_ctx, vd, vd, shift, fpst);
        break;
    default:
        g_assert_not_reached();
    }

    neon_store_reg32(tcg_ctx, vd, a->vd);
    tcg_temp_free_i32(tcg_ctx, vd);
    tcg_temp_free_i32(tcg_ctx, shift);
    tcg_temp_free_ptr(tcg_ctx, fpst);
    return true;
}